

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getrands.cpp
# Opt level: O2

void __thiscall getRands::getRands(getRands *this,rd_option rndopt,int rand_vec_size,int rand_seed)

{
  result_type __sd;
  value_type_conflict local_34;
  
  this->buf_ = (OASIS_FLOAT *)0x0;
  __sd = time((time_t *)0x0);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&this->gen_,__sd);
  *(undefined4 *)&(this->dis_)._M_param._M_a = 0;
  *(undefined4 *)((long)&(this->dis_)._M_param._M_a + 4) = 0;
  *(undefined4 *)&(this->dis_)._M_param._M_b = 0;
  *(undefined4 *)((long)&(this->dis_)._M_param._M_b + 4) = 0x3ff00000;
  this->rand_vec_size_ = rand_vec_size;
  this->rand_seed_ = rand_seed;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (0 < rand_seed) {
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(&this->gen_,(ulong)(uint)rand_seed);
  }
  this->rndopt_ = rndopt;
  this->base_offset_ = 0;
  if (rndopt == usecachedvector) {
    std::vector<float,_std::allocator<float>_>::resize(&this->rnd_,(long)rand_vec_size,&local_34);
  }
  else if (rndopt != usehashedseed) {
    if (rndopt != userandomnumberfile) {
      fprintf(_stderr,"FATAL: %s: Unknow random number option\n","getRands");
      exit(-1);
    }
    userandfile(this);
  }
  return;
}

Assistant:

getRands::getRands(rd_option rndopt, int rand_vec_size,int rand_seed) : gen_(time(0)), dis_(0, 1), rand_vec_size_(rand_vec_size), rand_seed_(rand_seed)
{
	if (rand_seed_ > 0) gen_.seed(rand_seed_);

	rndopt_ = rndopt;

	base_offset_ = 0;
	switch (rndopt_) {
		case rd_option::userandomnumberfile:
			userandfile();
		break;
		case rd_option::usecachedvector:
			rnd_.resize(rand_vec_size, -1);
		break;
		case rd_option::usehashedseed:
			// nothing to do
			break;
		default:
			fprintf(stderr, "FATAL: %s: Unknow random number option\n", __func__);
			exit(-1);
	}
	
}